

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall Imf_3_2::InputFile::Data::deleteCachedBuffer(Data *this)

{
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  *this_00;
  iterator iVar1;
  iterator iVar2;
  Iterator IVar3;
  ArgExc *this_01;
  _Rb_tree_color *p_Var4;
  
  if (this->cachedBuffer != (FrameBuffer *)0x0) {
    iVar1._M_node = (_Base_ptr)FrameBuffer::begin(this->cachedBuffer);
    iVar2._M_node = (_Base_ptr)FrameBuffer::end(this->cachedBuffer);
    if (iVar1._M_node != iVar2._M_node) {
      do {
        switch(iVar1._M_node[9]._M_color) {
        case _S_red:
        case 2:
          if (iVar1._M_node[9]._M_parent != (_Base_ptr)0x0) {
            p_Var4 = &(iVar1._M_node[9]._M_parent)->_M_color + this->offset;
LAB_001919fe:
            operator_delete__(p_Var4);
          }
          break;
        case _S_black:
          if (iVar1._M_node[9]._M_parent != (_Base_ptr)0x0) {
            p_Var4 = (_Rb_tree_color *)
                     ((long)&(iVar1._M_node[9]._M_parent)->_M_color + (long)this->offset * 2);
            goto LAB_001919fe;
          }
          break;
        case 3:
          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this_01,"Invalid pixel type");
          __cxa_throw(this_01,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
        IVar3 = FrameBuffer::end(this->cachedBuffer);
      } while ((iterator)iVar1._M_node != IVar3._i._M_node);
    }
    this_00 = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)this->cachedBuffer;
    if (this_00 !=
        (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
         *)0x0) {
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree(this_00);
    }
    operator_delete(this_00,0x30);
    this->cachedBuffer = (FrameBuffer *)0x0;
  }
  return;
}

Assistant:

void
InputFile::Data::deleteCachedBuffer ()
{
    //
    // Delete the cached frame buffer, and all memory
    // allocated for the slices in the cached frameBuffer.
    //

    if (cachedBuffer)
    {
        for (FrameBuffer::Iterator k = cachedBuffer->begin ();
             k != cachedBuffer->end ();
             ++k)
        {
            Slice& s = k.slice ();

            switch (s.type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                    delete[](((unsigned int*) s.base) + offset);
                    break;

                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                    delete[]((half*) s.base + offset);
                    break;

                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                    delete[](((float*) s.base) + offset);
                    break;
                case NUM_PIXELTYPES:
                    throw (IEX_NAMESPACE::ArgExc ("Invalid pixel type"));
            }
        }

        //
        // delete the cached frame buffer
        //

        delete cachedBuffer;
        cachedBuffer = 0;
    }
}